

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverSymbols.cpp
# Opt level: O0

void __thiscall
slang::ast::CoverCrossSymbol::serializeTo(CoverCrossSymbol *this,ASTSerializer *serializer)

{
  ASTSerializer *pAVar1;
  bool bVar2;
  basic_string_view<char,_std::char_traits<char>_> local_a0;
  Expression *local_90;
  Expression *iff;
  CoverageOptionSetter *opt;
  iterator __end3;
  iterator __begin3;
  span<const_slang::ast::CoverageOptionSetter,_18446744073709551615UL> *__range3;
  string_view local_58;
  CoverpointSymbol *local_48;
  CoverpointSymbol *target;
  iterator __end2;
  iterator __begin2;
  span<const_slang::ast::CoverpointSymbol_*const,_18446744073709551615UL> *__range2;
  ASTSerializer *local_18;
  ASTSerializer *serializer_local;
  CoverCrossSymbol *this_local;
  
  local_18 = serializer;
  serializer_local = (ASTSerializer *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&__range2,"targets");
  ASTSerializer::startArray(serializer,___range2);
  __begin2 = (iterator)&this->targets;
  __end2 = nonstd::span_lite::
           span<const_slang::ast::CoverpointSymbol_*const,_18446744073709551615UL>::begin
                     ((span<const_slang::ast::CoverpointSymbol_*const,_18446744073709551615UL> *)
                      __begin2);
  target = (CoverpointSymbol *)
           nonstd::span_lite::
           span<const_slang::ast::CoverpointSymbol_*const,_18446744073709551615UL>::end
                     ((span<const_slang::ast::CoverpointSymbol_*const,_18446744073709551615UL> *)
                      __begin2);
  for (; (CoverpointSymbol *)__end2 != target; __end2 = __end2 + 1) {
    local_48 = *__end2;
    ASTSerializer::startObject(local_18);
    pAVar1 = local_18;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_58,"coverpoint")
    ;
    ASTSerializer::writeLink(pAVar1,local_58,&local_48->super_Symbol);
    ASTSerializer::endObject(local_18);
  }
  ASTSerializer::endArray(local_18);
  bVar2 = nonstd::span_lite::span<const_slang::ast::CoverageOptionSetter,_18446744073709551615UL>::
          empty(&this->options);
  pAVar1 = local_18;
  if (!bVar2) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&__range3,"options");
    ASTSerializer::startArray(pAVar1,___range3);
    __begin3 = (iterator)&this->options;
    __end3 = nonstd::span_lite::span<const_slang::ast::CoverageOptionSetter,_18446744073709551615UL>
             ::begin((span<const_slang::ast::CoverageOptionSetter,_18446744073709551615UL> *)
                     __begin3);
    opt = nonstd::span_lite::span<const_slang::ast::CoverageOptionSetter,_18446744073709551615UL>::
          end((span<const_slang::ast::CoverageOptionSetter,_18446744073709551615UL> *)__begin3);
    for (; __end3 != opt; __end3 = __end3 + 1) {
      iff = (Expression *)__end3;
      CoverageOptionSetter::serializeTo(__end3,local_18);
    }
    ASTSerializer::endArray(local_18);
  }
  local_90 = getIffExpr(this);
  pAVar1 = local_18;
  if (local_90 != (Expression *)0x0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_a0,"iff");
    ASTSerializer::write(pAVar1,(int)local_a0._M_len,local_a0._M_str,(size_t)local_90);
  }
  return;
}

Assistant:

void CoverCrossSymbol::serializeTo(ASTSerializer& serializer) const {
    serializer.startArray("targets");
    for (auto target : targets) {
        serializer.startObject();
        serializer.writeLink("coverpoint", *target);
        serializer.endObject();
    }
    serializer.endArray();

    if (!options.empty()) {
        serializer.startArray("options");
        for (auto& opt : options)
            opt.serializeTo(serializer);
        serializer.endArray();
    }

    if (auto iff = getIffExpr())
        serializer.write("iff", *iff);
}